

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * gmlc::utilities::stringOps::xmlCharacterCodeReplace
                   (string *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  for (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,"&gt;",0,4); sVar4 != 0xffffffffffffffff;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"&gt;",sVar4 + 1,4)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar4,4,">",1);
  }
  for (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,"&lt;",0,4); sVar4 != 0xffffffffffffffff;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"&lt;",sVar4 + 1,4)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar4,4,"<",1);
  }
  for (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,"&quot;",0,6); sVar4 != 0xffffffffffffffff;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"&quot;",sVar4 + 1,6)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar4,6,"\"",1);
  }
  for (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,"&apos;",0,6); sVar4 != 0xffffffffffffffff;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"&apos;",sVar4 + 1,6)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar4,6,"\'",1);
  }
  for (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,"&amp;",0,5); sVar4 != 0xffffffffffffffff;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"&amp;",sVar4 + 1,5)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,sVar4,5,"&",1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmlCharacterCodeReplace(std::string str)
    {
        std::string out = std::move(str);
        auto codeLoc = out.find("&gt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, ">");
            codeLoc = out.find("&gt;", codeLoc + 1);
        }
        codeLoc = out.find("&lt;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 4, "<");
            codeLoc = out.find("&lt;", codeLoc + 1);
        }
        codeLoc = out.find("&quot;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "\"");
            codeLoc = out.find("&quot;", codeLoc + 1);
        }
        codeLoc = out.find("&apos;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 6, "'");
            codeLoc = out.find("&apos;", codeLoc + 1);
        }
        // &amp; is last so it can't trigger other sequences
        codeLoc = out.find("&amp;");
        while (codeLoc != std::string::npos) {
            out.replace(codeLoc, 5, "&");
            codeLoc = out.find("&amp;", codeLoc + 1);
        }
        return out;
    }